

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_0::SyncTest::deinit(SyncTest *this)

{
  deUint32 dVar1;
  Library *pLVar2;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    if (this->m_sync != (EGLSyncKHR)0x0) {
      (*pLVar2->_vptr_Library[0x18])(pLVar2);
      dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
      eglu::checkError(dVar1,"destroySyncKHR(m_eglDisplay, m_sync)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xef);
      this->m_sync = (EGLSyncKHR)0x0;
    }
    (*pLVar2->_vptr_Library[0x27])(pLVar2,this->m_eglDisplay,0,0,0);
    dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
    eglu::checkError(dVar1,
                     "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0xf3);
    if (this->m_eglContext != (EGLContext)0x0) {
      (*pLVar2->_vptr_Library[0x13])(pLVar2,this->m_eglDisplay);
      dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
      eglu::checkError(dVar1,"destroyContext(m_eglDisplay, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xf7);
      this->m_eglContext = (EGLContext)0x0;
    }
    if (this->m_eglSurface != (EGLSurface)0x0) {
      (*pLVar2->_vptr_Library[0x16])(pLVar2,this->m_eglDisplay);
      dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
      eglu::checkError(dVar1,"destroySurface(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xfd);
      this->m_eglSurface = (EGLSurface)0x0;
    }
    if (this->m_nativeWindow != (NativeWindow *)0x0) {
      (*this->m_nativeWindow->_vptr_NativeWindow[1])();
    }
    this->m_nativeWindow = (NativeWindow *)0x0;
    (*pLVar2->_vptr_Library[0x34])(pLVar2,this->m_eglDisplay);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void SyncTest::deinit (void)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		if (m_sync != EGL_NO_SYNC_KHR)
		{
			EGLU_CHECK_CALL(egl, destroySyncKHR(m_eglDisplay, m_sync));
			m_sync = EGL_NO_SYNC_KHR;
		}

		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		if (m_eglContext != EGL_NO_CONTEXT)
		{
			EGLU_CHECK_CALL(egl, destroyContext(m_eglDisplay, m_eglContext));
			m_eglContext = EGL_NO_CONTEXT;
		}

		if (m_eglSurface != EGL_NO_SURFACE)
		{
			EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));
			m_eglSurface = EGL_NO_SURFACE;
		}

		delete m_nativeWindow;
		m_nativeWindow = DE_NULL;

		egl.terminate(m_eglDisplay);
		m_eglDisplay = EGL_NO_DISPLAY;
	}
}